

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O3

ion_err_t ion_fwrite_at(ion_file_handle_t file,ion_file_offset_t offset,uint num_bytes,
                       ion_byte_t *to_write)

{
  ion_err_t iVar1;
  int iVar2;
  
  iVar2 = fseek((FILE *)file,offset,0);
  iVar1 = '\r';
  if (iVar2 == 0) {
    fwrite(to_write,(ulong)num_bytes,1,(FILE *)file);
    iVar1 = '\0';
  }
  return iVar1;
}

Assistant:

ion_err_t
ion_fwrite_at(
	ion_file_handle_t	file,
	ion_file_offset_t	offset,
	unsigned int		num_bytes,
	ion_byte_t			*to_write
) {
	ion_err_t error;

	error = ion_fseek(file, offset, ION_FILE_START);

	if (err_ok != error) {
		return error;
	}

	error = ion_fwrite(file, num_bytes, to_write);
	return error;
}